

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O1

void Abc_Sort_rec(int *pInBeg,int *pInEnd,int *pOutBeg)

{
  ulong uVar1;
  int *pInEnd_00;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar8 = (long)pInEnd - (long)pInBeg;
  uVar4 = (uint)(uVar8 >> 2);
  if ((int)uVar4 < 1) {
    __assert_fail("nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilSort.c"
                  ,0x53,"void Abc_Sort_rec(int *, int *, int *)");
  }
  if (uVar4 != 1) {
    if (uVar4 == 2) {
      iVar2 = pInBeg[1];
      if (iVar2 < *pInBeg) {
        pInBeg[1] = *pInBeg;
        *pInBeg = iVar2;
      }
    }
    else {
      if (7 < (int)uVar4) {
        uVar5 = uVar8 >> 1 & 0x1fffffffc;
        pInEnd_00 = (int *)((long)pInBeg + uVar5);
        Abc_Sort_rec(pInBeg,pInEnd_00,pOutBeg);
        Abc_Sort_rec(pInEnd_00,pInEnd,(int *)(uVar5 + (long)pOutBeg));
        Abc_SortMerge(pInBeg,pInEnd_00,pInEnd_00,pInEnd,pOutBeg);
        memcpy(pInBeg,pOutBeg,uVar8 & 0x1fffffffc);
        return;
      }
      if (uVar4 != 1) {
        uVar5 = 1;
        uVar8 = 0;
        do {
          uVar1 = uVar8 + 1;
          uVar7 = uVar8 & 0xffffffff;
          uVar6 = uVar5;
          do {
            uVar3 = uVar6 & 0xffffffff;
            if (pInBeg[(int)uVar7] <= pInBeg[uVar6]) {
              uVar3 = uVar7;
            }
            uVar7 = uVar3;
            uVar6 = uVar6 + 1;
          } while ((uVar4 & 0x7fffffff) != uVar6);
          iVar2 = pInBeg[uVar8];
          pInBeg[uVar8] = pInBeg[(int)uVar7];
          pInBeg[(int)uVar7] = iVar2;
          uVar5 = uVar5 + 1;
          uVar8 = uVar1;
        } while (uVar1 != uVar4 - 1);
      }
    }
  }
  return;
}

Assistant:

void Abc_Sort_rec( int * pInBeg, int * pInEnd, int * pOutBeg )
{
    int nSize = pInEnd - pInBeg;
    assert( nSize > 0 );
    if ( nSize == 1 )
        return;
    if ( nSize == 2 )
    {
         if ( pInBeg[0] > pInBeg[1] )
         {
             pInBeg[0] ^= pInBeg[1];
             pInBeg[1] ^= pInBeg[0];
             pInBeg[0] ^= pInBeg[1];
         }
    }
    else if ( nSize < 8 )
    {
        int temp, i, j, best_i;
        for ( i = 0; i < nSize-1; i++ )
        {
            best_i = i;
            for ( j = i+1; j < nSize; j++ )
                if ( pInBeg[j] < pInBeg[best_i] )
                    best_i = j;
            temp = pInBeg[i]; 
            pInBeg[i] = pInBeg[best_i]; 
            pInBeg[best_i] = temp;
        }
    }
    else
    {
        Abc_Sort_rec( pInBeg, pInBeg + nSize/2, pOutBeg );
        Abc_Sort_rec( pInBeg + nSize/2, pInEnd, pOutBeg + nSize/2 );
        Abc_SortMerge( pInBeg, pInBeg + nSize/2, pInBeg + nSize/2, pInEnd, pOutBeg );
        memcpy( pInBeg, pOutBeg, sizeof(int) * nSize );
    }
}